

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_ast.cpp
# Opt level: O3

void __thiscall lambda::parse_from::helper::comment(helper *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 *puVar4;
  string_view s;
  Shared_string local_28;
  
  iVar3 = std::istream::get();
LAB_00103378:
  do {
    if (iVar3 == 0x28) {
      iVar3 = std::istream::peek();
      if (iVar3 == 0x2a) {
        std::istream::get();
        comment(this);
        iVar3 = 0x28;
        goto LAB_00103378;
      }
    }
    else if (iVar3 == 0x2a) {
      iVar3 = std::istream::peek();
      if (iVar3 == 0x29) {
        std::istream::get();
        return;
      }
    }
    iVar3 = std::istream::get();
    if (iVar3 == -1) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(0x20);
      s._M_str = "unexpected end of file";
      s._M_len = 0x16;
      ublib::Shared_string::Shared_string(&local_28,s);
      *puVar4 = &PTR__Parse_error_00109ba8;
      puVar4[1] = local_28.length_;
      uVar1 = local_28.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_4_;
      uVar2 = local_28.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_;
      local_28.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(undefined4 *)(puVar4 + 2) =
           local_28.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _0_4_;
      *(undefined4 *)((long)puVar4 + 0x14) =
           local_28.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr.
           _4_4_;
      *(undefined4 *)(puVar4 + 3) = uVar1;
      *(undefined4 *)((long)puVar4 + 0x1c) = uVar2;
      local_28.underlying_.super___shared_ptr<const_char[],_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      __cxa_throw(puVar4,&Parse_error::typeinfo,Parse_error::~Parse_error);
    }
  } while( true );
}

Assistant:

void comment() {
      auto ch = inp.get();
      for (;;) {
        if (ch == '*' and inp.peek() == ')') {
          inp.get();
          return;
        } else if (ch == '(' and inp.peek() == '*') {
          inp.get();
          comment();
        } else {
          ch = inp.get();
          if (ch == eof) {
            throw Parse_error("unexpected end of file");
          }
        }
      }
    }